

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> __thiscall
enact::Parser::parseIfExpr(Parser *this)

{
  pointer puVar1;
  pointer pcVar2;
  long *plVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  long *plVar8;
  CompileContext *pCVar9;
  size_type *psVar10;
  Parser *in_RSI;
  pointer __old_p;
  size_type __dnew;
  undefined1 local_c8 [8];
  _Alloc_hider _Stack_c0;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  pointer local_58;
  undefined1 local_50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  local_68._8_4_ = (in_RSI->m_previous).type;
  local_58 = (pointer)(local_50 + 8);
  pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
  aStack_40._12_2_ = (in_RSI->m_previous).col;
  aStack_40._8_4_ = (in_RSI->m_previous).line;
  parseExpr((Parser *)(local_98 + 8));
  local_88._0_8_ = (pointer)0x2f;
  local_c8 = (undefined1  [8])local_b8;
  local_c8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_c8,(ulong)local_88);
  local_b8._0_8_ = local_88._0_8_;
  builtin_strncpy((char *)((long)&(((CompileContext *)local_c8)->m_source).field_2 + 0xf),"expressi"
                  ,8);
  builtin_strncpy((char *)((long)&(((CompileContext *)local_c8)->m_options).m_filename._M_dataplus.
                                  _M_p + 7),"on body.",8);
  (((CompileContext *)local_c8)->m_source).field_2._M_allocated_capacity = 0x66656220273e3d27;
  builtin_strncpy((char *)((long)&(((CompileContext *)local_c8)->m_source).field_2 + 8),"ore if e",8
                 );
  (((tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_> *)
   &(((CompileContext *)local_c8)->m_source)._M_dataplus._M_p)->
  super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>).
  super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl = (Stmt *)0x6465746365707845;
  (((CompileContext *)local_c8)->m_source)._M_string_length = 0x20726f20277b2720;
  _Stack_c0._M_p = (pointer)local_88._0_8_;
  *(undefined1 *)
   ((long)&(((tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_> *)
            &(((CompileContext *)local_c8)->m_source)._M_dataplus._M_p)->
           super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>).
           super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl + local_88._0_8_) = 0;
  expectBlock((Parser *)local_98,(string *)in_RSI);
  if (local_c8 != (undefined1  [8])local_b8) {
    operator_delete((void *)local_c8,(ulong)(local_b8._0_8_ + 1));
  }
  local_88._0_8_ = 0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  puVar7 = (undefined8 *)operator_new(0x38);
  local_c8._0_4_ = (in_RSI->m_previous).type;
  puVar1 = (pointer)(local_b8 + 8);
  pcVar2 = (in_RSI->m_previous).lexeme._M_dataplus._M_p;
  _Stack_c0._M_p = (pointer)puVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_c0,pcVar2,pcVar2 + (in_RSI->m_previous).lexeme._M_string_length);
  *puVar7 = &PTR__UnitExpr_00126f10;
  *(undefined4 *)(puVar7 + 1) = local_c8._0_4_;
  puVar7[2] = puVar7 + 4;
  if ((pointer)_Stack_c0._M_p == puVar1) {
    puVar7[4] = local_b8._8_8_;
    puVar7[5] = aStack_a8._0_8_;
  }
  else {
    puVar7[2] = _Stack_c0._M_p;
    puVar7[4] = local_b8._8_8_;
  }
  puVar7[3] = local_b8._0_8_;
  *(line_t *)(puVar7 + 6) = (in_RSI->m_previous).line;
  *(col_t *)((long)puVar7 + 0x34) = (in_RSI->m_previous).col;
  plVar8 = (long *)operator_new(0x28);
  uVar6 = local_88._16_8_;
  uVar5 = local_88._8_8_;
  uVar4 = local_88._0_8_;
  local_88._0_8_ = (pointer)0x0;
  local_88._8_8_ = (pointer)0x0;
  local_88._16_8_ = (pointer)0x0;
  *plVar8 = (long)&PTR__BlockExpr_00126f68;
  plVar8[1] = uVar4;
  plVar8[2] = uVar5;
  plVar8[3] = uVar6;
  local_b8._0_8_ = (pointer)0x0;
  local_c8 = (undefined1  [8])0x0;
  _Stack_c0._M_p = (pointer)0x0;
  plVar8[4] = (long)puVar7;
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_c8);
  std::
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ::~vector((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)local_88);
  if ((in_RSI->m_current).type == ELSE) {
    advance(in_RSI);
    if ((in_RSI->m_current).type == IF) {
      advance(in_RSI);
      parseIfExpr((Parser *)local_c8);
      plVar3 = (long *)plVar8[4];
      plVar8[4] = (long)local_c8;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
    }
    else {
      local_88._0_8_ = (pointer)0x22;
      local_c8 = (undefined1  [8])local_b8;
      local_c8 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_c8,(ulong)local_88)
      ;
      local_b8._0_8_ = local_88._0_8_;
      (((CompileContext *)local_c8)->m_source).field_2._M_allocated_capacity = 0x74666120273e3d27;
      builtin_strncpy((char *)((long)&(((CompileContext *)local_c8)->m_source).field_2 + 8),
                      "er \'else",8);
      (((tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_> *)
       &(((CompileContext *)local_c8)->m_source)._M_dataplus._M_p)->
      super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>).
      super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl = (Stmt *)0x6465746365707845;
      (((CompileContext *)local_c8)->m_source)._M_string_length = 0x20726f20277b2720;
      *(undefined2 *)&(((CompileContext *)local_c8)->m_options).m_filename._M_dataplus._M_p = 0x2e27
      ;
      _Stack_c0._M_p = (pointer)local_88._0_8_;
      *(undefined1 *)
       ((long)&(((tuple<enact::Stmt_*,_std::default_delete<enact::Stmt>_> *)
                &(((CompileContext *)local_c8)->m_source)._M_dataplus._M_p)->
               super__Tuple_impl<0UL,_enact::Stmt_*,_std::default_delete<enact::Stmt>_>).
               super__Head_base<0UL,_enact::Stmt_*,_false>._M_head_impl + local_88._0_8_) = 0;
      expectBlock((Parser *)local_68,(string *)in_RSI);
      (**(code **)(*plVar8 + 8))(plVar8);
      plVar8 = (long *)local_68._0_8_;
      if (local_c8 != (undefined1  [8])local_b8) {
        operator_delete((void *)local_c8,(ulong)(local_b8._0_8_ + 1));
      }
    }
  }
  pCVar9 = (CompileContext *)operator_new(0x50);
  if (local_58 == (pointer)(local_50 + 8)) {
    aStack_a8._0_8_ = aStack_40._M_allocated_capacity;
    local_58 = puVar1;
  }
  (pCVar9->m_source)._M_dataplus._M_p = (pointer)&PTR__IfExpr_00127290;
  (pCVar9->m_source)._M_string_length = local_98._8_8_;
  (pCVar9->m_source).field_2._M_allocated_capacity = local_98._0_8_;
  *(long **)((long)&(pCVar9->m_source).field_2 + 8) = plVar8;
  *(undefined4 *)&(pCVar9->m_options).m_filename._M_dataplus._M_p = local_68._8_4_;
  psVar10 = (size_type *)((long)&(pCVar9->m_options).m_filename.field_2 + 8);
  (pCVar9->m_options).m_filename._M_string_length = (size_type)psVar10;
  if (local_58 == puVar1) {
    *psVar10 = local_50._8_8_;
    (pCVar9->m_options).m_programArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)aStack_a8._0_8_;
  }
  else {
    (pCVar9->m_options).m_filename._M_string_length = (size_type)local_58;
    *(undefined8 *)((long)&(pCVar9->m_options).m_filename.field_2 + 8) = local_50._8_8_;
  }
  (pCVar9->m_options).m_filename.field_2._M_allocated_capacity = local_50._0_8_;
  *(undefined4 *)
   &(pCVar9->m_options).m_programArgs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = aStack_40._8_4_;
  *(undefined2 *)
   ((long)&(pCVar9->m_options).m_programArgs.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = aStack_40._12_2_;
  this->m_context = pCVar9;
  return (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)
         (__uniq_ptr_data<enact::Expr,_std::default_delete<enact::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parseIfExpr() {
        Token keyword = m_previous;

        std::unique_ptr<Expr> condition = parseExpr();
        std::unique_ptr<BlockExpr> thenBlock = expectBlock("Expected '{' or '=>' before if expression body.");

        std::unique_ptr<BlockExpr> elseBlock = std::make_unique<BlockExpr>(
                std::vector<std::unique_ptr<Stmt>>{},
                std::make_unique<UnitExpr>(m_previous));

        if (consume(TokenType::ELSE)) {
            // Special case, so we can type 'else if' instead of 'else => if'
            if (consume(TokenType::IF)) {
                elseBlock->expr = parseIfExpr();
            } else {
                elseBlock = expectBlock("Expected '{' or '=>' after 'else'.");
            }
        }

        return std::make_unique<IfExpr>(
                std::move(condition),
                std::move(thenBlock),
                std::move(elseBlock),
                std::move(keyword));
    }